

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  long lVar1;
  Comparator *pCVar2;
  Version *pVVar3;
  FileMetaData *pFVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  pointer ppFVar8;
  long lVar9;
  Slice local_40;
  
  bVar5 = true;
  if ((long)this->level_ < 5) {
    pCVar2 = (this->input_version_->vset_->icmp_).user_comparator_;
    bVar5 = false;
    lVar9 = (long)this->level_ + 2;
    do {
      pVVar3 = this->input_version_;
      uVar7 = this->level_ptrs_[lVar9];
      ppFVar8 = pVVar3->files_[lVar9].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar7 < (ulong)((long)pVVar3->files_[lVar9].
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3)) {
        do {
          pFVar4 = ppFVar8[uVar7];
          local_40 = InternalKey::user_key(&pFVar4->largest);
          iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_40);
          if (iVar6 < 1) {
            local_40 = InternalKey::user_key(&pFVar4->smallest);
            iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_40);
            if (-1 < iVar6) {
              return bVar5;
            }
            break;
          }
          uVar7 = this->level_ptrs_[lVar9] + 1;
          this->level_ptrs_[lVar9] = uVar7;
          ppFVar8 = pVVar3->files_[lVar9].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)pVVar3->files_[lVar9].
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >>
                                3));
      }
      lVar1 = lVar9 + 1;
      bVar5 = 5 < lVar9;
      lVar9 = lVar1;
    } while ((int)lVar1 != 7);
  }
  return bVar5;
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}